

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::Trim(EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint uVar1;
  
  if (this->had_error_ == false) {
    uVar1 = Flush(this,ptr);
    (*this->stream_->_vptr_ZeroCopyOutputStream[3])(this->stream_,(ulong)uVar1);
    ptr = this->buffer_;
    this->end_ = ptr;
    this->buffer_end_ = ptr;
  }
  return ptr;
}

Assistant:

uint8_t* EpsCopyOutputStream::Trim(uint8_t* ptr) {
  if (had_error_) return ptr;
  int s = Flush(ptr);
  stream_->BackUp(s);
  // Reset to initial state (expecting new buffer)
  buffer_end_ = end_ = buffer_;
  return buffer_;
}